

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O0

FilterMode vk::mapVkMinTexFilter(VkFilter filter,VkSamplerMipmapMode mipMode)

{
  VkSamplerMipmapMode mipMode_local;
  VkFilter filter_local;
  
  if (filter == VK_FILTER_NEAREST) {
    if (mipMode == VK_SAMPLER_MIPMAP_MODE_NEAREST) {
      return NEAREST_MIPMAP_NEAREST;
    }
    if (mipMode == VK_SAMPLER_MIPMAP_MODE_LINEAR) {
      return NEAREST_MIPMAP_LINEAR;
    }
  }
  else if (filter == VK_FILTER_LINEAR) {
    if (mipMode == VK_SAMPLER_MIPMAP_MODE_NEAREST) {
      return LINEAR_MIPMAP_NEAREST;
    }
    if (mipMode == VK_SAMPLER_MIPMAP_MODE_LINEAR) {
      return LINEAR_MIPMAP_LINEAR;
    }
  }
  return FILTERMODE_LAST;
}

Assistant:

tcu::Sampler::FilterMode mapVkMinTexFilter (VkFilter filter, VkSamplerMipmapMode mipMode)
{
	switch (filter)
	{
		case VK_FILTER_LINEAR:
			switch (mipMode)
			{
				case VK_SAMPLER_MIPMAP_MODE_LINEAR:		return tcu::Sampler::LINEAR_MIPMAP_LINEAR;
				case VK_SAMPLER_MIPMAP_MODE_NEAREST:	return tcu::Sampler::LINEAR_MIPMAP_NEAREST;
				default:
					break;
			}
			break;

		case VK_FILTER_NEAREST:
			switch (mipMode)
			{
				case VK_SAMPLER_MIPMAP_MODE_LINEAR:		return tcu::Sampler::NEAREST_MIPMAP_LINEAR;
				case VK_SAMPLER_MIPMAP_MODE_NEAREST:	return tcu::Sampler::NEAREST_MIPMAP_NEAREST;
				default:
					break;
			}
			break;

		default:
			break;
	}

	DE_ASSERT(false);
	return tcu::Sampler::FILTERMODE_LAST;
}